

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

string_t duckdb::VectorStringCastOperator<duckdb::NumericTryCastToBit>::
         Operation<short,duckdb::string_t>(short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  void *pvVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  string_t data;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  string local_30;
  
  pvVar1 = dataptr;
  Bit::NumericToBit<short>(&local_30,input);
  if ((uint)local_30._M_string_length < 0xd) {
    uStack_34 = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    if ((uint)local_30._M_string_length != 0) {
      switchD_00b1422a::default
                (&uStack_3c,local_30._M_dataplus._M_p,(ulong)((uint)local_30._M_string_length & 0xf)
                );
    }
  }
  else {
    uStack_3c = *(undefined4 *)local_30._M_dataplus._M_p;
    uStack_38 = SUB84(local_30._M_dataplus._M_p,0);
    uStack_34 = (undefined4)((ulong)local_30._M_dataplus._M_p >> 0x20);
  }
  data.value._4_1_ = (undefined1)uStack_34;
  data.value._5_1_ = uStack_34._1_1_;
  data.value._6_1_ = uStack_34._2_1_;
  data.value._7_1_ = uStack_34._3_1_;
  data.value.pointer.length = uStack_38;
  data.value.pointer.ptr = (char *)pvVar1;
  aVar2.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddStringOrBlob
                 ((StringVector *)dataptr,
                  (Vector *)CONCAT44(uStack_3c,(uint)local_30._M_string_length),data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto result = reinterpret_cast<Vector *>(dataptr);
		return OP::template Operation<INPUT_TYPE>(input, *result);
	}